

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglRenderCase.cpp
# Opt level: O3

void __thiscall
deqp::egl::RenderCase::executeForConfig(RenderCase *this,EGLDisplay display,EGLConfig config)

{
  EglTestContext *pEVar1;
  NativeDisplay *nativeDisplay;
  Library *egl;
  EGLint EVar2;
  Visibility VVar3;
  int iVar4;
  deUint32 err;
  undefined8 *puVar5;
  long *plVar6;
  NativeWindowFactory *pNVar7;
  undefined4 extraout_var;
  EGLSurface pvVar8;
  NativePixmapFactory *pNVar9;
  NativePixmap *pixmap;
  undefined4 extraout_var_00;
  size_type *psVar10;
  ulong uVar11;
  WindowParams params;
  EGLint surfaceAttribs [5];
  string failReason;
  ostringstream s;
  long *local_300;
  undefined8 local_2f8;
  long local_2f0;
  undefined8 uStack_2e8;
  EGLint local_2dc;
  long *local_2d8;
  undefined8 local_2d0;
  long local_2c8;
  undefined8 uStack_2c0;
  ulong *local_2b8;
  long local_2b0;
  ulong local_2a8 [2];
  string local_298;
  ulong *local_278;
  long local_270;
  ulong local_268 [2];
  ulong *local_258;
  long local_250;
  ulong local_248 [2];
  ulong *local_238;
  long local_230;
  ulong local_228 [2];
  TestLog *local_218;
  string local_210;
  Library *local_1f0;
  NativeDisplayFactory *local_1e8;
  long *local_1e0 [2];
  long local_1d0 [2];
  ScopedLogSection local_1c0;
  ScopedLogSection local_1b8;
  ScopedLogSection local_1b0;
  UniqueSurface local_1a8 [4];
  ios_base local_138 [264];
  NativeWindow *window;
  
  local_1f0 = EglTestContext::getLibrary((this->super_SimpleConfigCase).super_TestCase.m_eglTestCtx)
  ;
  local_218 = ((this->super_SimpleConfigCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx
              )->m_log;
  EVar2 = eglu::getConfigID(local_1f0,display,config);
  pEVar1 = (this->super_SimpleConfigCase).super_TestCase.m_eglTestCtx;
  local_1e8 = pEVar1->m_nativeDisplayFactory;
  nativeDisplay =
       (pEVar1->m_nativeDisplay).
       super_UniqueBase<eglu::NativeDisplay,_de::DefaultDeleter<eglu::NativeDisplay>_>.m_data.ptr;
  local_1e0[0] = local_1d0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1e0,0x1af8059);
  local_2dc = EVar2;
  if ((this->m_surfaceTypeMask & 4) != 0) {
    local_2b8 = local_2a8;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_2b8,"Config","");
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    std::ostream::operator<<(local_1a8,EVar2);
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    std::ios_base::~ios_base(local_138);
    uVar11 = 0xf;
    if (local_2b8 != local_2a8) {
      uVar11 = local_2a8[0];
    }
    if (uVar11 < (ulong)(local_230 + local_2b0)) {
      uVar11 = 0xf;
      if (local_238 != local_228) {
        uVar11 = local_228[0];
      }
      if (uVar11 < (ulong)(local_230 + local_2b0)) goto LAB_00e75303;
      puVar5 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_238,0,(char *)0x0,(ulong)local_2b8);
    }
    else {
LAB_00e75303:
      puVar5 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_2b8,(ulong)local_238);
    }
    local_300 = &local_2f0;
    plVar6 = puVar5 + 2;
    if ((long *)*puVar5 == plVar6) {
      local_2f0 = *plVar6;
      uStack_2e8 = puVar5[3];
    }
    else {
      local_2f0 = *plVar6;
      local_300 = (long *)*puVar5;
    }
    local_2f8 = puVar5[1];
    *puVar5 = plVar6;
    puVar5[1] = 0;
    *(undefined1 *)plVar6 = 0;
    plVar6 = (long *)std::__cxx11::string::append((char *)&local_300);
    local_298._M_dataplus._M_p = (pointer)&local_298.field_2;
    psVar10 = (size_type *)(plVar6 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar6 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar10) {
      local_298.field_2._M_allocated_capacity = *psVar10;
      local_298.field_2._8_4_ = (undefined4)plVar6[3];
      local_298.field_2._12_4_ = *(undefined4 *)((long)plVar6 + 0x1c);
    }
    else {
      local_298.field_2._M_allocated_capacity = *psVar10;
      local_298._M_dataplus._M_p = (pointer)*plVar6;
    }
    local_298._M_string_length = plVar6[1];
    *plVar6 = (long)psVar10;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    local_278 = local_268;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_278,"Config ID ","");
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    std::ostream::operator<<(local_1a8,EVar2);
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    std::ios_base::~ios_base(local_138);
    uVar11 = 0xf;
    if (local_278 != local_268) {
      uVar11 = local_268[0];
    }
    if (uVar11 < (ulong)(local_250 + local_270)) {
      uVar11 = 0xf;
      if (local_258 != local_248) {
        uVar11 = local_248[0];
      }
      if (uVar11 < (ulong)(local_250 + local_270)) goto LAB_00e7549c;
      puVar5 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_258,0,(char *)0x0,(ulong)local_278);
    }
    else {
LAB_00e7549c:
      puVar5 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_278,(ulong)local_258);
    }
    local_2d8 = &local_2c8;
    plVar6 = puVar5 + 2;
    if ((long *)*puVar5 == plVar6) {
      local_2c8 = *plVar6;
      uStack_2c0 = puVar5[3];
    }
    else {
      local_2c8 = *plVar6;
      local_2d8 = (long *)*puVar5;
    }
    local_2d0 = puVar5[1];
    *puVar5 = plVar6;
    puVar5[1] = 0;
    *(undefined1 *)plVar6 = 0;
    plVar6 = (long *)std::__cxx11::string::append((char *)&local_2d8);
    psVar10 = (size_type *)(plVar6 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar6 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar10) {
      local_210.field_2._M_allocated_capacity = *psVar10;
      local_210.field_2._8_8_ = plVar6[3];
      local_210._M_dataplus._M_p = (pointer)&local_210.field_2;
    }
    else {
      local_210.field_2._M_allocated_capacity = *psVar10;
      local_210._M_dataplus._M_p = (pointer)*plVar6;
    }
    local_210._M_string_length = plVar6[1];
    *plVar6 = (long)psVar10;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    tcu::ScopedLogSection::ScopedLogSection(&local_1b0,local_218,&local_298,&local_210);
    tcu::TestLog::endSection(local_1b0.m_log);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_210._M_dataplus._M_p != &local_210.field_2) {
      operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
    }
    EVar2 = local_2dc;
    if (local_2d8 != &local_2c8) {
      operator_delete(local_2d8,local_2c8 + 1);
    }
    if (local_258 != local_248) {
      operator_delete(local_258,local_248[0] + 1);
    }
    if (local_278 != local_268) {
      operator_delete(local_278,local_268[0] + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_298._M_dataplus._M_p != &local_298.field_2) {
      operator_delete(local_298._M_dataplus._M_p,local_298.field_2._M_allocated_capacity + 1);
    }
    if (local_300 != &local_2f0) {
      operator_delete(local_300,local_2f0 + 1);
    }
    if (local_238 != local_228) {
      operator_delete(local_238,local_228[0] + 1);
    }
    if (local_2b8 != local_2a8) {
      operator_delete(local_2b8,local_2a8[0] + 1);
    }
    pNVar7 = eglu::selectNativeWindowFactory
                       (local_1e8,
                        ((this->super_SimpleConfigCase).super_TestCase.super_TestCase.super_TestNode
                        .m_testCtx)->m_cmdLine);
    VVar3 = eglu::parseWindowVisibility
                      (((this->super_SimpleConfigCase).super_TestCase.super_TestCase.super_TestNode.
                       m_testCtx)->m_cmdLine);
    local_300 = (long *)0x8000000080;
    local_2f8 = CONCAT44(local_2f8._4_4_,VVar3);
    iVar4 = (*(pNVar7->super_FactoryBase).super_AbstractFactory._vptr_AbstractFactory[4])
                      (pNVar7,nativeDisplay,display,config);
    window = (NativeWindow *)CONCAT44(extraout_var,iVar4);
    pvVar8 = eglu::createWindowSurface(nativeDisplay,window,display,config,(EGLAttrib *)0x0);
    eglu::UniqueSurface::UniqueSurface(local_1a8,local_1f0,display,pvVar8);
    local_298._M_string_length = 4;
    local_298._M_dataplus._M_p = (pointer)config;
    (*(this->super_SimpleConfigCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode[6])
              (this,display,local_1a8[0].m_surface);
    eglu::UniqueSurface::~UniqueSurface(local_1a8);
    (*window->_vptr_NativeWindow[1])(window);
  }
  if ((this->m_surfaceTypeMask & 2) != 0) {
    local_2b8 = local_2a8;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_2b8,"Config","");
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    std::ostream::operator<<(local_1a8,EVar2);
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    std::ios_base::~ios_base(local_138);
    uVar11 = 0xf;
    if (local_2b8 != local_2a8) {
      uVar11 = local_2a8[0];
    }
    if (uVar11 < (ulong)(local_230 + local_2b0)) {
      uVar11 = 0xf;
      if (local_238 != local_228) {
        uVar11 = local_228[0];
      }
      if (uVar11 < (ulong)(local_230 + local_2b0)) goto LAB_00e7581b;
      puVar5 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_238,0,(char *)0x0,(ulong)local_2b8);
    }
    else {
LAB_00e7581b:
      puVar5 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_2b8,(ulong)local_238);
    }
    local_300 = &local_2f0;
    plVar6 = puVar5 + 2;
    if ((long *)*puVar5 == plVar6) {
      local_2f0 = *plVar6;
      uStack_2e8 = puVar5[3];
    }
    else {
      local_2f0 = *plVar6;
      local_300 = (long *)*puVar5;
    }
    local_2f8 = puVar5[1];
    *puVar5 = plVar6;
    puVar5[1] = 0;
    *(undefined1 *)plVar6 = 0;
    plVar6 = (long *)std::__cxx11::string::append((char *)&local_300);
    local_298._M_dataplus._M_p = (pointer)&local_298.field_2;
    psVar10 = (size_type *)(plVar6 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar6 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar10) {
      local_298.field_2._M_allocated_capacity = *psVar10;
      local_298.field_2._8_4_ = (undefined4)plVar6[3];
      local_298.field_2._12_4_ = *(undefined4 *)((long)plVar6 + 0x1c);
    }
    else {
      local_298.field_2._M_allocated_capacity = *psVar10;
      local_298._M_dataplus._M_p = (pointer)*plVar6;
    }
    local_298._M_string_length = plVar6[1];
    *plVar6 = (long)psVar10;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    local_278 = local_268;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_278,"Config ID ","");
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    std::ostream::operator<<(local_1a8,EVar2);
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    std::ios_base::~ios_base(local_138);
    uVar11 = 0xf;
    if (local_278 != local_268) {
      uVar11 = local_268[0];
    }
    if (uVar11 < (ulong)(local_250 + local_270)) {
      uVar11 = 0xf;
      if (local_258 != local_248) {
        uVar11 = local_248[0];
      }
      if (uVar11 < (ulong)(local_250 + local_270)) goto LAB_00e759b4;
      puVar5 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_258,0,(char *)0x0,(ulong)local_278);
    }
    else {
LAB_00e759b4:
      puVar5 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_278,(ulong)local_258);
    }
    local_2d8 = &local_2c8;
    plVar6 = puVar5 + 2;
    if ((long *)*puVar5 == plVar6) {
      local_2c8 = *plVar6;
      uStack_2c0 = puVar5[3];
    }
    else {
      local_2c8 = *plVar6;
      local_2d8 = (long *)*puVar5;
    }
    local_2d0 = puVar5[1];
    *puVar5 = plVar6;
    puVar5[1] = 0;
    *(undefined1 *)plVar6 = 0;
    plVar6 = (long *)std::__cxx11::string::append((char *)&local_2d8);
    psVar10 = (size_type *)(plVar6 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar6 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar10) {
      local_210.field_2._M_allocated_capacity = *psVar10;
      local_210.field_2._8_8_ = plVar6[3];
      local_210._M_dataplus._M_p = (pointer)&local_210.field_2;
    }
    else {
      local_210.field_2._M_allocated_capacity = *psVar10;
      local_210._M_dataplus._M_p = (pointer)*plVar6;
    }
    local_210._M_string_length = plVar6[1];
    *plVar6 = (long)psVar10;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    tcu::ScopedLogSection::ScopedLogSection(&local_1b8,local_218,&local_298,&local_210);
    tcu::TestLog::endSection(local_1b8.m_log);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_210._M_dataplus._M_p != &local_210.field_2) {
      operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
    }
    EVar2 = local_2dc;
    if (local_2d8 != &local_2c8) {
      operator_delete(local_2d8,local_2c8 + 1);
    }
    if (local_258 != local_248) {
      operator_delete(local_258,local_248[0] + 1);
    }
    if (local_278 != local_268) {
      operator_delete(local_278,local_268[0] + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_298._M_dataplus._M_p != &local_298.field_2) {
      operator_delete(local_298._M_dataplus._M_p,local_298.field_2._M_allocated_capacity + 1);
    }
    if (local_300 != &local_2f0) {
      operator_delete(local_300,local_2f0 + 1);
    }
    if (local_238 != local_228) {
      operator_delete(local_238,local_228[0] + 1);
    }
    if (local_2b8 != local_2a8) {
      operator_delete(local_2b8,local_2a8[0] + 1);
    }
    pNVar9 = eglu::selectNativePixmapFactory
                       (local_1e8,
                        ((this->super_SimpleConfigCase).super_TestCase.super_TestCase.super_TestNode
                        .m_testCtx)->m_cmdLine);
    pixmap = (NativePixmap *)
             (**(code **)(*(long *)pNVar9 + 0x20))(pNVar9,nativeDisplay,display,config,0,0x80,0x80);
    pvVar8 = eglu::createPixmapSurface(nativeDisplay,pixmap,display,config,(EGLAttrib *)0x0);
    eglu::UniqueSurface::UniqueSurface(local_1a8,local_1f0,display,pvVar8);
    local_298._M_string_length = 2;
    local_298._M_dataplus._M_p = (pointer)config;
    (*(this->super_SimpleConfigCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode[6])
              (this,display,local_1a8[0].m_surface);
    eglu::UniqueSurface::~UniqueSurface(local_1a8);
    (**(code **)(*(long *)pixmap + 8))(pixmap);
  }
  if ((this->m_surfaceTypeMask & 1) == 0) goto LAB_00e7614a;
  local_2b8 = local_2a8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2b8,"Config","");
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  std::ostream::operator<<(local_1a8,EVar2);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base(local_138);
  uVar11 = 0xf;
  if (local_2b8 != local_2a8) {
    uVar11 = local_2a8[0];
  }
  if (uVar11 < (ulong)(local_230 + local_2b0)) {
    uVar11 = 0xf;
    if (local_238 != local_228) {
      uVar11 = local_228[0];
    }
    if (uVar11 < (ulong)(local_230 + local_2b0)) goto LAB_00e75d1e;
    puVar5 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_238,0,(char *)0x0,(ulong)local_2b8);
  }
  else {
LAB_00e75d1e:
    puVar5 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_2b8,(ulong)local_238);
  }
  local_300 = &local_2f0;
  plVar6 = puVar5 + 2;
  if ((long *)*puVar5 == plVar6) {
    local_2f0 = *plVar6;
    uStack_2e8 = puVar5[3];
  }
  else {
    local_2f0 = *plVar6;
    local_300 = (long *)*puVar5;
  }
  local_2f8 = puVar5[1];
  *puVar5 = plVar6;
  puVar5[1] = 0;
  *(undefined1 *)plVar6 = 0;
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_300);
  psVar10 = (size_type *)(plVar6 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar6 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar10) {
    local_298.field_2._M_allocated_capacity = *psVar10;
    local_298.field_2._8_4_ = (undefined4)plVar6[3];
    local_298.field_2._12_4_ = *(undefined4 *)((long)plVar6 + 0x1c);
    local_298._M_dataplus._M_p = (pointer)&local_298.field_2;
  }
  else {
    local_298.field_2._M_allocated_capacity = *psVar10;
    local_298._M_dataplus._M_p = (pointer)*plVar6;
  }
  local_298._M_string_length = plVar6[1];
  *plVar6 = (long)psVar10;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  local_278 = local_268;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_278,"Config ID ","");
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  std::ostream::operator<<(local_1a8,EVar2);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base(local_138);
  uVar11 = 0xf;
  if (local_278 != local_268) {
    uVar11 = local_268[0];
  }
  if (uVar11 < (ulong)(local_250 + local_270)) {
    uVar11 = 0xf;
    if (local_258 != local_248) {
      uVar11 = local_248[0];
    }
    if (uVar11 < (ulong)(local_250 + local_270)) goto LAB_00e75ec0;
    puVar5 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_258,0,(char *)0x0,(ulong)local_278);
  }
  else {
LAB_00e75ec0:
    puVar5 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_278,(ulong)local_258);
  }
  local_2d8 = &local_2c8;
  plVar6 = puVar5 + 2;
  if ((long *)*puVar5 == plVar6) {
    local_2c8 = *plVar6;
    uStack_2c0 = puVar5[3];
  }
  else {
    local_2c8 = *plVar6;
    local_2d8 = (long *)*puVar5;
  }
  local_2d0 = puVar5[1];
  *puVar5 = plVar6;
  puVar5[1] = 0;
  *(undefined1 *)plVar6 = 0;
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_2d8);
  psVar10 = (size_type *)(plVar6 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar6 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar10) {
    local_210.field_2._M_allocated_capacity = *psVar10;
    local_210.field_2._8_8_ = plVar6[3];
    local_210._M_dataplus._M_p = (pointer)&local_210.field_2;
  }
  else {
    local_210.field_2._M_allocated_capacity = *psVar10;
    local_210._M_dataplus._M_p = (pointer)*plVar6;
  }
  local_210._M_string_length = plVar6[1];
  *plVar6 = (long)psVar10;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  tcu::ScopedLogSection::ScopedLogSection(&local_1c0,local_218,&local_298,&local_210);
  tcu::TestLog::endSection(local_1c0.m_log);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_210._M_dataplus._M_p != &local_210.field_2) {
    operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
  }
  egl = local_1f0;
  if (local_2d8 != &local_2c8) {
    operator_delete(local_2d8,local_2c8 + 1);
  }
  if (local_258 != local_248) {
    operator_delete(local_258,local_248[0] + 1);
  }
  if (local_278 != local_268) {
    operator_delete(local_278,local_268[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_298._M_dataplus._M_p != &local_298.field_2) {
    operator_delete(local_298._M_dataplus._M_p,local_298.field_2._M_allocated_capacity + 1);
  }
  if (local_300 != &local_2f0) {
    operator_delete(local_300,local_2f0 + 1);
  }
  if (local_238 != local_228) {
    operator_delete(local_238,local_228[0] + 1);
  }
  if (local_2b8 != local_2a8) {
    operator_delete(local_2b8,local_2a8[0] + 1);
  }
  local_298._M_dataplus._M_p = (pointer)0x8000003057;
  local_298._M_string_length = 0x8000003056;
  local_298.field_2._M_allocated_capacity._0_4_ = 0x3038;
  iVar4 = (*egl->_vptr_Library[10])(egl,display,config);
  eglu::UniqueSurface::UniqueSurface
            (local_1a8,egl,display,(EGLSurface)CONCAT44(extraout_var_00,iVar4));
  err = (*egl->_vptr_Library[0x1f])(egl);
  eglu::checkError(err,"eglCreatePbufferSurface()",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglRenderCase.cpp"
                   ,0xbe);
  local_2f8 = 1;
  local_300 = (long *)config;
  (*(this->super_SimpleConfigCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode[6])
            (this,display,local_1a8[0].m_surface);
  eglu::UniqueSurface::~UniqueSurface(local_1a8);
LAB_00e7614a:
  if (local_1e0[0] != local_1d0) {
    operator_delete(local_1e0[0],local_1d0[0] + 1);
  }
  return;
}

Assistant:

void RenderCase::executeForConfig (EGLDisplay display, EGLConfig config)
{
	const Library&						egl				= m_eglTestCtx.getLibrary();
	tcu::TestLog&						log				= m_testCtx.getLog();
	const int							width			= 128;
	const int							height			= 128;
	const EGLint						configId		= eglu::getConfigID(egl, display, config);

	const eglu::NativeDisplayFactory&	displayFactory	= m_eglTestCtx.getNativeDisplayFactory();
	eglu::NativeDisplay&				nativeDisplay	= m_eglTestCtx.getNativeDisplay();

	bool								isOk			= true;
	string								failReason		= "";

	if (m_surfaceTypeMask & EGL_WINDOW_BIT)
	{
		tcu::ScopedLogSection(log,
							  string("Config") + de::toString(configId) + "-Window",
							  string("Config ID ") + de::toString(configId) + ", window surface");

		const eglu::NativeWindowFactory&	windowFactory	= eglu::selectNativeWindowFactory(displayFactory, m_testCtx.getCommandLine());

		try
		{
			const eglu::WindowParams			params		(width, height, eglu::parseWindowVisibility(m_testCtx.getCommandLine()));
			de::UniquePtr<eglu::NativeWindow>	window		(windowFactory.createWindow(&nativeDisplay, display, config, DE_NULL, params));
			EGLSurface							eglSurface	= createWindowSurface(nativeDisplay, *window, display, config, DE_NULL);
			eglu::UniqueSurface					surface		(egl, display, eglSurface);

			executeForSurface(display, *surface, Config(config, EGL_WINDOW_BIT, 0));
		}
		catch (const tcu::TestError& e)
		{
			log << e;
			isOk = false;
			failReason = e.what();
		}
	}

	if (m_surfaceTypeMask & EGL_PIXMAP_BIT)
	{
		tcu::ScopedLogSection(log,
							  string("Config") + de::toString(configId) + "-Pixmap",
							  string("Config ID ") + de::toString(configId) + ", pixmap surface");

		const eglu::NativePixmapFactory&	pixmapFactory	= eglu::selectNativePixmapFactory(displayFactory, m_testCtx.getCommandLine());

		try
		{
			std::auto_ptr<eglu::NativePixmap>	pixmap		(pixmapFactory.createPixmap(&nativeDisplay, display, config, DE_NULL, width, height));
			EGLSurface							eglSurface	= createPixmapSurface(nativeDisplay, *pixmap, display, config, DE_NULL);
			eglu::UniqueSurface					surface		(egl, display, eglSurface);

			executeForSurface(display, *surface, Config(config, EGL_PIXMAP_BIT, 0));
		}
		catch (const tcu::TestError& e)
		{
			log << e;
			isOk = false;
			failReason = e.what();
		}
	}

	if (m_surfaceTypeMask & EGL_PBUFFER_BIT)
	{
		tcu::ScopedLogSection(log,
							  string("Config") + de::toString(configId) + "-Pbuffer",
							  string("Config ID ") + de::toString(configId) + ", pbuffer surface");
		try
		{
			const EGLint surfaceAttribs[] =
			{
				EGL_WIDTH,	width,
				EGL_HEIGHT,	height,
				EGL_NONE
			};

			eglu::UniqueSurface surface(egl, display, egl.createPbufferSurface(display, config, surfaceAttribs));
			EGLU_CHECK_MSG(egl, "eglCreatePbufferSurface()");

			executeForSurface(display, *surface, Config(config, EGL_PBUFFER_BIT, 0));
		}
		catch (const tcu::TestError& e)
		{
			log << e;
			isOk = false;
			failReason = e.what();
		}
	}

	if (!isOk && m_testCtx.getTestResult() == QP_TEST_RESULT_PASS)
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, failReason.c_str());
}